

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

bool str_suffix(char *astr,char *bstr)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_RSI;
  char *in_RDI;
  int sstr2;
  int sstr1;
  
  sVar2 = strlen(in_RDI);
  sVar3 = strlen(in_RSI);
  if (((int)sVar2 <= (int)sVar3) &&
     (bVar1 = str_cmp(in_RDI,in_RSI + ((long)(int)sVar3 - (long)(int)sVar2)), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool str_suffix(const char *astr, const char *bstr)
{
	int sstr1 = strlen(astr);
	int sstr2 = strlen(bstr);

	if (sstr1 <= sstr2 && !str_cmp(astr, bstr + sstr2 - sstr1))
		return false;
	else
		return true;
}